

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCoberturaCoverage.cxx
# Opt level: O3

void __thiscall
cmParseCoberturaCoverage::XMLParser::StartElement(XMLParser *this,string *name,char **atts)

{
  char *pcVar1;
  cmCTest *pcVar2;
  pointer pcVar3;
  iterator __position;
  key_type *__k;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  mapped_type *pmVar8;
  size_t sVar9;
  long lVar10;
  long *plVar11;
  pointer pbVar12;
  ostream *poVar13;
  _func_int **pp_Var14;
  _func_int **pp_Var15;
  ulong uVar16;
  char **ppcVar17;
  long lVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string filename;
  string finalpath;
  string FoundSource;
  string line;
  ifstream fin;
  key_type *local_438;
  long *local_430 [2];
  long local_420 [2];
  long *local_410;
  long local_408;
  long local_400 [2];
  char *local_3f0;
  undefined8 local_3e8;
  char local_3e0;
  undefined7 uStack_3df;
  undefined1 *local_3d0;
  undefined8 local_3c8;
  undefined1 local_3c0;
  undefined7 uStack_3bf;
  undefined1 local_3b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0 [6];
  ios_base local_340 [264];
  undefined1 local_238 [16];
  _func_int *local_228;
  long lStack_220;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  local_3d0 = &local_3c0;
  local_3c8 = 0;
  local_3c0 = 0;
  local_3f0 = &local_3e0;
  local_3e8 = 0;
  local_3e0 = '\0';
  iVar5 = std::__cxx11::string::compare((char *)name);
  if (iVar5 == 0) {
    this->InSource = true;
    goto LAB_002c1c3f;
  }
  iVar5 = std::__cxx11::string::compare((char *)name);
  if (iVar5 == 0) {
    this->InSources = true;
    goto LAB_002c1c3f;
  }
  iVar5 = std::__cxx11::string::compare((char *)name);
  if (iVar5 != 0) {
    iVar5 = std::__cxx11::string::compare((char *)name);
    if ((iVar5 == 0) && (this->SkipThisClass == false)) {
      ppcVar17 = atts + 1;
      iVar5 = -1;
      uVar7 = 0xffffffff;
      do {
        pcVar1 = ppcVar17[-1];
        iVar6 = strcmp(pcVar1,"hits");
        if (iVar6 == 0) {
          iVar5 = atoi(*ppcVar17);
        }
        else {
          iVar6 = strcmp(pcVar1,"number");
          if (iVar6 == 0) {
            uVar7 = atoi(*ppcVar17);
          }
        }
        ppcVar17 = ppcVar17 + 1;
      } while ((int)uVar7 < 1 || iVar5 < 0);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::operator[](&this->Coverage->TotalCoverage,&this->CurFileName);
      (pmVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[(ulong)uVar7 - 1] = iVar5;
    }
    goto LAB_002c1c3f;
  }
  do {
    iVar5 = strcmp(*atts,"filename");
    atts = atts + 1;
  } while (iVar5 != 0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"Reading file: ",0xe);
  pcVar1 = *atts;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)(_func_int *)
                         ((long)&local_438 + (long)*(_func_int **)(local_238._0_8_ + -0x18)) + 0x200
                   );
  }
  else {
    sVar9 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar1,sVar9);
  }
  std::ios::widen((char)(ostream *)local_238 + (char)*(_func_int **)(local_238._0_8_ + -0x18));
  std::ostream::put((char)local_238);
  std::ostream::flush();
  pcVar2 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,4,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmParseCoberturaCoverage.cxx"
               ,0x45,(char *)local_3b0._0_8_,this->Coverage->Quiet);
  if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
    operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0[0]._M_allocated_capacity + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
  std::ios_base::~ios_base(local_1c8);
  std::__cxx11::string::string((string *)&local_410,*atts,(allocator *)local_238);
  local_438 = &this->CurFileName;
  std::__cxx11::string::_M_replace
            ((ulong)local_438,0,(char *)(this->CurFileName)._M_string_length,0x66eafa);
  pbVar12 = (this->FilePaths).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->FilePaths).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar12) {
    lVar18 = 8;
    uVar16 = 0;
    do {
      lVar10 = std::__cxx11::string::find
                         ((char *)&local_410,*(ulong *)((long)pbVar12 + lVar18 + -8),0);
      if (lVar10 == 0) {
        std::__cxx11::string::_M_assign((string *)local_438);
        break;
      }
      uVar16 = uVar16 + 1;
      pbVar12 = (this->FilePaths).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar18 = lVar18 + 0x20;
    } while (uVar16 < (ulong)((long)(this->FilePaths).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12 >> 5)
            );
  }
  iVar5 = std::__cxx11::string::compare((char *)local_438);
  if ((iVar5 == 0) &&
     (pbVar12 = (this->FilePaths).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
     (this->FilePaths).
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish != pbVar12)) {
    lVar18 = 8;
    uVar16 = 0;
    do {
      local_3b0._0_8_ = local_3b0 + 0x10;
      lVar10 = *(long *)((long)pbVar12 + lVar18 + -8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_3b0,lVar10,
                 *(long *)((long)&(pbVar12->_M_dataplus)._M_p + lVar18) + lVar10);
      std::__cxx11::string::append((char *)local_3b0);
      plVar11 = (long *)std::__cxx11::string::_M_append((char *)local_3b0,(ulong)local_410);
      pp_Var15 = (_func_int **)(plVar11 + 2);
      if ((_func_int **)*plVar11 == pp_Var15) {
        local_228 = *pp_Var15;
        lStack_220 = plVar11[3];
        local_238._0_8_ = &local_228;
      }
      else {
        local_228 = *pp_Var15;
        local_238._0_8_ = (_func_int **)*plVar11;
      }
      local_238._8_8_ = plVar11[1];
      *plVar11 = (long)pp_Var15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_3f0,(string *)local_238);
      if ((_func_int **)local_238._0_8_ != &local_228) {
        operator_delete((void *)local_238._0_8_,(ulong)(local_228 + 1));
      }
      if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
        operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0[0]._M_allocated_capacity + 1));
      }
      bVar4 = cmsys::SystemTools::FileExists(local_3f0);
      if (bVar4) {
        std::__cxx11::string::_M_assign((string *)local_438);
        break;
      }
      uVar16 = uVar16 + 1;
      pbVar12 = (this->FilePaths).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar18 = lVar18 + 0x20;
    } while (uVar16 < (ulong)((long)(this->FilePaths).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12 >> 5)
            );
  }
  __k = local_438;
  std::ifstream::ifstream(local_238,(local_438->_M_dataplus)._M_p,_S_in);
  iVar5 = std::__cxx11::string::compare((char *)__k);
  pp_Var15 = (_func_int **)(local_3b0 + 0x10);
  if ((iVar5 == 0) || ((abStack_218[(long)*(_func_int **)(local_238._0_8_ + -0x18)] & 5) != 0)) {
    pcVar3 = (this->Coverage->BinaryDir)._M_dataplus._M_p;
    local_430[0] = local_420;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_430,pcVar3,pcVar3 + (this->Coverage->BinaryDir)._M_string_length);
    std::__cxx11::string::append((char *)local_430);
    plVar11 = (long *)std::__cxx11::string::append((char *)local_430);
    pp_Var14 = (_func_int **)(plVar11 + 2);
    if ((_func_int **)*plVar11 == pp_Var14) {
      local_3a0[0]._0_8_ = *pp_Var14;
      local_3a0[0]._8_8_ = plVar11[3];
      local_3b0._0_8_ = pp_Var15;
    }
    else {
      local_3a0[0]._0_8_ = *pp_Var14;
      local_3b0._0_8_ = (_func_int **)*plVar11;
    }
    local_3b0._8_8_ = plVar11[1];
    *plVar11 = (long)pp_Var14;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::__cxx11::string::operator=((string *)__k,(string *)local_3b0);
    if ((_func_int **)local_3b0._0_8_ != pp_Var15) {
      operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0[0]._M_allocated_capacity + 1));
    }
    if (local_430[0] != local_420) {
      operator_delete(local_430[0],local_420[0] + 1);
    }
    std::ifstream::open(local_238,(_Ios_Openmode)(__k->_M_dataplus)._M_p);
    if ((abStack_218[(long)*(_func_int **)(local_238._0_8_ + -0x18)] & 5) == 0) goto LAB_002c1b6a;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b0,"Skipping system file ",0x15);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3b0,(char *)local_410,local_408);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,4,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmParseCoberturaCoverage.cxx"
                 ,0x67,(char *)local_430[0],this->Coverage->Quiet);
    if (local_430[0] != local_420) {
      operator_delete(local_430[0],local_420[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
    std::ios_base::~ios_base(local_340);
    this->SkipThisClass = true;
  }
  else {
LAB_002c1b6a:
    local_3b0._8_8_ = 0;
    local_3a0[0]._M_allocated_capacity = local_3a0[0]._M_allocated_capacity & 0xffffffffffffff00;
    local_3b0._0_8_ = pp_Var15;
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
             ::operator[](&this->Coverage->TotalCoverage,__k);
    while (bVar4 = cmsys::SystemTools::GetLineFromStream
                             ((istream *)local_238,(string *)local_3b0,(bool *)0x0,-1), bVar4) {
      local_430[0] = (long *)CONCAT44(local_430[0]._4_4_,0xffffffff);
      __position._M_current =
           (pmVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (__position._M_current ==
          (pmVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (pmVar8,__position,(int *)local_430);
      }
      else {
        *__position._M_current = -1;
        (pmVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
    }
    if ((_func_int **)local_3b0._0_8_ != pp_Var15) {
      operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0[0]._M_allocated_capacity + 1));
    }
  }
  std::ifstream::~ifstream(local_238);
  if (local_410 != local_400) {
    operator_delete(local_410,local_400[0] + 1);
  }
LAB_002c1c3f:
  if (local_3f0 != &local_3e0) {
    operator_delete(local_3f0,CONCAT71(uStack_3df,local_3e0) + 1);
  }
  if (local_3d0 != &local_3c0) {
    operator_delete(local_3d0,CONCAT71(uStack_3bf,local_3c0) + 1);
  }
  return;
}

Assistant:

void StartElement(const std::string& name, const char** atts) CM_OVERRIDE
  {
    std::string FoundSource;
    std::string finalpath;
    if (name == "source") {
      this->InSource = true;
    } else if (name == "sources") {
      this->InSources = true;
    } else if (name == "class") {
      int tagCount = 0;
      while (true) {
        if (strcmp(atts[tagCount], "filename") == 0) {
          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "Reading file: " << atts[tagCount + 1]
                                              << std::endl,
                             this->Coverage.Quiet);
          std::string filename = atts[tagCount + 1];
          this->CurFileName = "";

          // Check if this is an absolute path that falls within our
          // source or binary directories.
          for (size_t i = 0; i < FilePaths.size(); i++) {
            if (filename.find(FilePaths[i]) == 0) {
              this->CurFileName = filename;
              break;
            }
          }

          if (this->CurFileName == "") {
            // Check if this is a path that is relative to our source or
            // binary directories.
            for (size_t i = 0; i < FilePaths.size(); i++) {
              finalpath = FilePaths[i] + "/" + filename;
              if (cmSystemTools::FileExists(finalpath.c_str())) {
                this->CurFileName = finalpath;
                break;
              }
            }
          }

          cmsys::ifstream fin(this->CurFileName.c_str());
          if (this->CurFileName == "" || !fin) {
            this->CurFileName =
              this->Coverage.BinaryDir + "/" + atts[tagCount + 1];
            fin.open(this->CurFileName.c_str());
            if (!fin) {
              cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                                 "Skipping system file " << filename
                                                         << std::endl,
                                 this->Coverage.Quiet);

              this->SkipThisClass = true;
              break;
            }
          }
          std::string line;
          FileLinesType& curFileLines =
            this->Coverage.TotalCoverage[this->CurFileName];
          while (cmSystemTools::GetLineFromStream(fin, line)) {
            curFileLines.push_back(-1);
          }

          break;
        }
        ++tagCount;
      }
    } else if (name == "line") {
      int tagCount = 0;
      int curNumber = -1;
      int curHits = -1;
      while (true) {
        if (this->SkipThisClass) {
          break;
        }
        if (strcmp(atts[tagCount], "hits") == 0) {
          curHits = atoi(atts[tagCount + 1]);
        } else if (strcmp(atts[tagCount], "number") == 0) {
          curNumber = atoi(atts[tagCount + 1]);
        }

        if (curHits > -1 && curNumber > 0) {
          FileLinesType& curFileLines =
            this->Coverage.TotalCoverage[this->CurFileName];
          {
            curFileLines[curNumber - 1] = curHits;
          }
          break;
        }
        ++tagCount;
      }
    }
  }